

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineSegmentedPath.cpp
# Opt level: O3

void __thiscall
OpenSteer::PolylineSegmentedPath::movePoints
          (PolylineSegmentedPath *this,size_type startIndex,size_type numOfPoints,Vec3 *newPoints)

{
  pointer pVVar1;
  pointer pVVar2;
  float fVar3;
  int iVar4;
  long lVar5;
  size_type sVar6;
  
  if (numOfPoints != 0) {
    pVVar1 = (this->points_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = 8;
    sVar6 = numOfPoints;
    do {
      *(undefined8 *)((long)pVVar1 + lVar5 + startIndex * 0xc + -8) =
           *(undefined8 *)((long)newPoints + lVar5 + -8);
      *(undefined4 *)((long)&pVVar1[startIndex].x + lVar5) =
           *(undefined4 *)((long)&newPoints->x + lVar5);
      lVar5 = lVar5 + 0xc;
      sVar6 = sVar6 - 1;
    } while (sVar6 != 0);
  }
  iVar4 = (*(this->super_SegmentedPath).super_Path._vptr_Path[6])(this);
  if ((startIndex == 0) && ((char)iVar4 != '\0')) {
    pVVar1 = (this->points_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar2 = (this->points_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    fVar3 = pVVar1->y;
    pVVar2[-1].x = pVVar1->x;
    pVVar2[-1].y = fVar3;
    pVVar2[-1].z = pVVar1->z;
  }
  iVar4 = (*(this->super_SegmentedPath).super_Path._vptr_Path[6])(this);
  anon_unknown.dwarf_dbad6::updateTangentsAndLengths
            ((anon_unknown_dwarf_dbad6 *)
             (this->points_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (Vec3Container *)
             (this->segmentTangents_).
             super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>._M_impl.
             super__Vector_impl_data._M_start,
             (Vec3Container *)
             (this->segmentTangents_).
             super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (FloatContainer *)
             (this->segmentLengths_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,startIndex,numOfPoints,SUB41(iVar4,0));
  return;
}

Assistant:

void 
OpenSteer::PolylineSegmentedPath::movePoints( size_type startIndex,
                                              size_type numOfPoints,
                                              Vec3 const newPoints[] )
{
    assert( ( startIndex < ( pointCount() - ( isCyclic() ? 1 : 0 ) ) ) && 
            "startIndex must be inside index range." );
    assert( ( ( startIndex + numOfPoints ) <= ( pointCount() - ( isCyclic() ? 1 : 0 ) ) ) && 
            "The max. index of a point to set must be inside the index range." ); 
    
    // Update the point positions.
    // @todo Remove this line size_type const pathPointCount = pointCount();
    for ( size_type i = 0; i < numOfPoints; ++i ) {
        points_[ startIndex + i ] = newPoints[ i ];
    }
    
    // If the first point is changed and the path is cyclic also change the
    // last point, which is just a copy of the first point.
    if ( isCyclic() && ( 0 == startIndex ) ) {
        points_.back() = points_.front();
    }
    
    // Recalculate the tangents and lengths.
    updateTangentsAndLengths( points_, 
                              segmentTangents_, 
                              segmentLengths_, 
                              startIndex, 
                              numOfPoints, 
                              isCyclic() );
    
    
    assert( adjacentPathPointsDifferent( points_.begin(), points_.end(), isCyclic() ) && "Adjacent path points must be different." );
}